

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialAttributeDecoder::DecodeValues
          (SequentialAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  size_type sVar1;
  int64_t iVar2;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *in_RSI;
  DecoderBuffer *in_RDI;
  int i;
  int out_byte_pos;
  uint8_t *value_data;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> value_data_ptr;
  int entry_size;
  int32_t num_values;
  DataBuffer *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_40;
  bool local_1;
  
  sVar1 = std::
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          ::size(in_RSI);
  iVar2 = GeometryAttribute::byte_stride((GeometryAttribute *)in_RDI->pos_);
  operator_new__((long)(int)iVar2);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
             (uchar *)in_stack_ffffffffffffff98);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  local_40 = 0;
  do {
    if ((int)sVar1 <= local_40) {
      local_1 = true;
LAB_002102e8:
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
      return local_1;
    }
    in_stack_ffffffffffffffa7 =
         DecoderBuffer::Decode
                   (in_RDI,(void *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                    (size_t)in_stack_ffffffffffffff98);
    if (!(bool)in_stack_ffffffffffffffa7) {
      local_1 = false;
      goto LAB_002102e8;
    }
    in_stack_ffffffffffffff98 = PointAttribute::buffer((PointAttribute *)0x21029f);
    DataBuffer::Write((DataBuffer *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (int64_t)in_RDI,
                      (void *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                      (size_t)in_stack_ffffffffffffff98);
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

bool SequentialAttributeDecoder::DecodeValues(
    const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
  const int32_t num_values = static_cast<uint32_t>(point_ids.size());
  const int entry_size = static_cast<int>(attribute_->byte_stride());
  std::unique_ptr<uint8_t[]> value_data_ptr(new uint8_t[entry_size]);
  uint8_t *const value_data = value_data_ptr.get();
  int out_byte_pos = 0;
  // Decode raw attribute values in their original format.
  for (int i = 0; i < num_values; ++i) {
    if (!in_buffer->Decode(value_data, entry_size)) {
      return false;
    }
    attribute_->buffer()->Write(out_byte_pos, value_data, entry_size);
    out_byte_pos += entry_size;
  }
  return true;
}